

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall
google::protobuf::SourceCodeInfo_Location::MergePartialFromCodedStream
          (SourceCodeInfo_Location *this,CodedInputStream *input)

{
  uint8 uVar1;
  bool bVar2;
  uint uVar3;
  Limit limit;
  int iVar4;
  uint8 *puVar5;
  string *psVar6;
  uint8 *puVar7;
  uint32 uVar8;
  RepeatedField<int> *value;
  UnknownFieldSet *unknown_fields;
  uint32 length;
  uint32 temp;
  uint32 local_4c;
  uint32 local_48;
  Limit local_44;
  UnknownFieldSet *local_40;
  RepeatedField<int> *local_38;
  
  value = &this->path_;
  unknown_fields = &this->_unknown_fields_;
  local_40 = unknown_fields;
  local_38 = value;
LAB_001f3576:
  puVar5 = input->buffer_;
  if ((puVar5 < input->buffer_end_) && (uVar8 = (uint32)(char)*puVar5, -1 < (char)*puVar5)) {
    input->last_tag_ = uVar8;
    input->buffer_ = puVar5 + 1;
  }
  else {
    uVar8 = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = uVar8;
  }
  if (uVar8 == 0) {
    return true;
  }
  uVar3 = uVar8 & 7;
  switch(uVar8 >> 3) {
  case 1:
    if (uVar3 == 0) {
      bVar2 = internal::WireFormatLite::
              ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (1,10,input,value);
      if (!bVar2) {
        return false;
      }
    }
    else {
      if (uVar3 != 2) goto switchD_001f35ca_default;
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar1 = *puVar5, -1 < (char)uVar1)) {
        input->buffer_ = puVar5 + 1;
        local_4c = (int)(char)uVar1;
      }
      else {
        bVar2 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
        if (!bVar2) {
          return false;
        }
      }
      local_44 = io::CodedInputStream::PushLimit(input,local_4c);
      while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar1 = *puVar5, -1 < (char)uVar1)) {
          input->buffer_ = puVar5 + 1;
          uVar8 = (int)(char)uVar1;
        }
        else {
          bVar2 = io::CodedInputStream::ReadVarint32Fallback(input,&local_48);
          uVar8 = local_48;
          if (!bVar2) {
            return false;
          }
        }
        iVar4 = (this->path_).current_size_;
        if (iVar4 == (this->path_).total_size_) {
          RepeatedField<int>::Reserve(value,iVar4 + 1);
          iVar4 = (this->path_).current_size_;
        }
        (this->path_).current_size_ = iVar4 + 1;
        (this->path_).elements_[iVar4] = uVar8;
      }
      io::CodedInputStream::PopLimit(input,local_44);
      unknown_fields = local_40;
    }
    puVar5 = input->buffer_;
    puVar7 = input->buffer_end_;
    if ((puVar7 <= puVar5) || (*puVar5 != '\x12')) goto LAB_001f3576;
    puVar5 = puVar5 + 1;
    input->buffer_ = puVar5;
LAB_001f3752:
    if ((puVar5 < puVar7) && (uVar1 = *puVar5, -1 < (char)uVar1)) {
      input->buffer_ = puVar5 + 1;
      local_4c = (int)(char)uVar1;
    }
    else {
      bVar2 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
      if (!bVar2) {
        return false;
      }
    }
    limit = io::CodedInputStream::PushLimit(input,local_4c);
    while (iVar4 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar4) {
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar1 = *puVar5, -1 < (char)uVar1)) {
        input->buffer_ = puVar5 + 1;
        uVar8 = (int)(char)uVar1;
      }
      else {
        bVar2 = io::CodedInputStream::ReadVarint32Fallback(input,&local_48);
        uVar8 = local_48;
        if (!bVar2) {
          return false;
        }
      }
      iVar4 = (this->span_).current_size_;
      if (iVar4 == (this->span_).total_size_) {
        RepeatedField<int>::Reserve(&this->span_,iVar4 + 1);
        iVar4 = (this->span_).current_size_;
      }
      (this->span_).current_size_ = iVar4 + 1;
      (this->span_).elements_[iVar4] = uVar8;
    }
    io::CodedInputStream::PopLimit(input,limit);
    value = local_38;
    unknown_fields = local_40;
    break;
  case 2:
    if (uVar3 != 0) {
      if (uVar3 != 2) goto switchD_001f35ca_default;
      puVar5 = input->buffer_;
      puVar7 = input->buffer_end_;
      goto LAB_001f3752;
    }
    bVar2 = internal::WireFormatLite::
            ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      (1,0x12,input,&this->span_);
    if (!bVar2) {
      return false;
    }
    break;
  case 3:
    if (uVar3 != 2) goto switchD_001f35ca_default;
    goto LAB_001f3830;
  case 4:
    if (uVar3 != 2) goto switchD_001f35ca_default;
    goto LAB_001f38a5;
  default:
    goto switchD_001f35ca_default;
  }
  puVar5 = input->buffer_;
  if ((puVar5 < input->buffer_end_) && (*puVar5 == '\x1a')) {
    input->buffer_ = puVar5 + 1;
LAB_001f3830:
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
    psVar6 = this->leading_comments_;
    if (psVar6 == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar6 = (string *)operator_new(0x20);
      (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
      psVar6->_M_string_length = 0;
      (psVar6->field_2)._M_local_buf[0] = '\0';
      this->leading_comments_ = psVar6;
    }
    bVar2 = internal::WireFormatLite::ReadString(input,psVar6);
    if (!bVar2) {
      return false;
    }
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->leading_comments_->_M_dataplus)._M_p,
               (int)this->leading_comments_->_M_string_length,PARSE);
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (*puVar5 == '\"')) {
      input->buffer_ = puVar5 + 1;
LAB_001f38a5:
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
      psVar6 = this->trailing_comments_;
      if (psVar6 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        this->trailing_comments_ = psVar6;
      }
      bVar2 = internal::WireFormatLite::ReadString(input,psVar6);
      if (!bVar2) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->trailing_comments_->_M_dataplus)._M_p,
                 (int)this->trailing_comments_->_M_string_length,PARSE);
      if ((input->buffer_ == input->buffer_end_) &&
         ((input->buffer_size_after_limit_ != 0 ||
          (input->total_bytes_read_ == input->current_limit_)))) {
        input->last_tag_ = 0;
        input->legitimate_message_end_ = true;
        return true;
      }
    }
  }
  goto LAB_001f3576;
switchD_001f35ca_default:
  if (uVar3 == 4) {
    return true;
  }
  bVar2 = internal::WireFormat::SkipField(input,uVar8,unknown_fields);
  if (!bVar2) {
    return false;
  }
  goto LAB_001f3576;
}

Assistant:

bool SourceCodeInfo_Location::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int32 path = 1 [packed = true];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_path())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 10, input, this->mutable_path())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_span;
        break;
      }

      // repeated int32 span = 2 [packed = true];
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_span:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_span())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 18, input, this->mutable_span())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_leading_comments;
        break;
      }

      // optional string leading_comments = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_leading_comments:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_leading_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->leading_comments().data(), this->leading_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_trailing_comments;
        break;
      }

      // optional string trailing_comments = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_trailing_comments:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_trailing_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->trailing_comments().data(), this->trailing_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}